

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O3

void __thiscall
pbrt::MLTIntegrator::MLTIntegrator
          (MLTIntegrator *this,CameraHandle *camera,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,int maxDepth,
          int nBootstrap,int nChains,int mutationsPerPixel,Float sigma,Float largeStepProbability,
          bool regularize)

{
  pointer pLVar1;
  pointer pLVar2;
  PowerLightSampler *this_00;
  Allocator alloc;
  span<const_pbrt::LightHandle> lights_00;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_50;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_38;
  
  local_38.bits =
       (aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector(&local_50,lights);
  Integrator::Integrator(&this->super_Integrator,(PrimitiveHandle *)&local_38,&local_50);
  if (local_50.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Integrator)._vptr_Integrator = (_func_int **)&PTR__Integrator_0309de60;
  this_00 = (PowerLightSampler *)operator_new(0x70);
  pLVar1 = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  lights_00.n = (long)pLVar2 - (long)pLVar1 >> 3;
  lights_00.ptr = pLVar1;
  PowerLightSampler::PowerLightSampler(this_00,lights_00,alloc);
  (this->lightSampler).
  super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  .bits = (ulong)this_00 | 0x2000000000000;
  this->regularize = regularize;
  (this->camera).
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  .bits = 0;
  (this->camera).
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  .bits = (camera->
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          ).bits;
  this->maxDepth = maxDepth;
  this->nBootstrap = nBootstrap;
  this->mutationsPerPixel = mutationsPerPixel;
  this->sigma = sigma;
  this->largeStepProbability = largeStepProbability;
  this->nChains = nChains;
  return;
}

Assistant:

MLTIntegrator(CameraHandle camera, PrimitiveHandle aggregate,
                  std::vector<LightHandle> lights, int maxDepth, int nBootstrap,
                  int nChains, int mutationsPerPixel, Float sigma,
                  Float largeStepProbability, bool regularize)
        : Integrator(aggregate, lights),
          lightSampler(new PowerLightSampler(lights, Allocator())),
          camera(camera),
          maxDepth(maxDepth),
          nBootstrap(nBootstrap),
          nChains(nChains),
          mutationsPerPixel(mutationsPerPixel),
          sigma(sigma),
          largeStepProbability(largeStepProbability),
          regularize(regularize) {}